

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RouterAccess.cpp
# Opt level: O2

bool __thiscall bhf::ads::RouterAccess::PciScan(RouterAccess *this,uint64_t pci_id,ostream *os)

{
  long lVar1;
  ostream *poVar2;
  ulong uVar3;
  bool bVar4;
  string sStack_10e8;
  uint32_t bytesRead;
  SearchPciBusReq req;
  stringstream stream;
  ostream local_10a8 [380];
  SearchPciBusResNew res;
  
  memset(&res,0,0xf04);
  req.leVendorID = (uint16_t)(pci_id >> 0x30);
  req.leDeviceID = (uint16_t)(pci_id >> 0x20);
  req.leSubVendorID = (uint16_t)(pci_id >> 0x10);
  req.leSubSystemID = (uint16_t)pci_id;
  lVar1 = AdsDevice::ReadWriteReqEx2(&this->device,5,3,0xf04,&res,8,&req,&bytesRead);
  if (lVar1 == 0) {
    if (0x40 < res.leFound) {
      std::__cxx11::stringstream::stringstream((stringstream *)&stream);
      poVar2 = std::operator<<(local_10a8,"PciScan");
      poVar2 = std::operator<<(poVar2,"(): data seems corrupt. Slot count 0x");
      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2," exceeds maximum 0x");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<(poVar2," -> truncating\n");
      std::__cxx11::stringbuf::str();
      Logger::Log(2,&sStack_10e8);
      std::__cxx11::string::~string((string *)&sStack_10e8);
      std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    }
    uVar3 = 0x40;
    if (res.leFound < 0x40) {
      uVar3 = (ulong)res.leFound;
    }
    poVar2 = std::operator<<(os,"PCI devices found: ");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,'\n');
    for (lVar1 = 0; (lVar1 != 0xf00 && (uVar3 * 0x3c - lVar1 != 0)); lVar1 = lVar1 + 0x3c) {
      poVar2 = operator<<(os,(SearchPciSlotResNew *)
                             ((long)res.slot._M_elems[0].leBaseAddresses._M_elems + lVar1));
      std::operator<<(poVar2,'\n');
    }
    bVar4 = *(int *)(os + *(long *)(*(long *)os + -0x18) + 0x20) != 0;
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&stream);
    poVar2 = std::operator<<(local_10a8,"PciScan");
    poVar2 = std::operator<<(poVar2,"(): failed with: 0x");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::operator<<(poVar2,'\n');
    std::__cxx11::stringbuf::str();
    Logger::Log(3,&sStack_10e8);
    std::__cxx11::string::~string((string *)&sStack_10e8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool RouterAccess::PciScan(const uint64_t pci_id, std::ostream& os) const
{
#define ROUTERADSGRP_ACCESS_HARDWARE 0x00000005
#define ROUTERADSOFFS_A_HW_SEARCHPCIBUS 0x00000003

    SearchPciBusResNew res {};
    uint32_t bytesRead;

    const auto req = SearchPciBusReq {pci_id};
    const auto status = device.ReadWriteReqEx2(
        ROUTERADSGRP_ACCESS_HARDWARE,
        ROUTERADSOFFS_A_HW_SEARCHPCIBUS,
        sizeof(res), &res,
        sizeof(req), &req,
        &bytesRead
        );

    if (ADSERR_NOERR != status) {
        LOG_ERROR(__FUNCTION__ << "(): failed with: 0x" << std::hex << status << '\n');
        return false;
    }

    if (res.slot.size() < res.nFound()) {
        LOG_WARN(__FUNCTION__
                 << "(): data seems corrupt. Slot count 0x" << std::hex << res.nFound() << " exceeds maximum 0x" << res.slot.size() <<
                 " -> truncating\n");
    }

    auto limit = std::min<size_t>(res.slot.size(), res.nFound());
    os << "PCI devices found: " << std::dec << limit << '\n';
    for (const auto& slot: res.slot) {
        if (!limit--) {
            break;
        }
        os << slot << '\n';
    }
    return !os.good();
}